

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_str(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  String local_60;
  undefined1 local_50 [32];
  Value local_30;
  IntrinsicResult *local_20;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  local_20 = partialResult;
  partialResult_local = (IntrinsicResult *)context;
  context_local = (Context *)this;
  String::String(&local_60,"x");
  Context::GetVar((Context *)local_50,(String *)context,(LocalOnlyMode)&local_60);
  Value::ToString((Value *)(local_50 + 0x10),(Machine *)local_50);
  Value::Value(&local_30,(String *)(local_50 + 0x10));
  IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_30,true);
  Value::~Value(&local_30);
  String::~String((String *)(local_50 + 0x10));
  Value::~Value((Value *)local_50);
  String::~String(&local_60);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_str(Context *context, IntrinsicResult partialResult) {
		return IntrinsicResult(context->GetVar("x").ToString());
	}